

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lex.cpp
# Opt level: O3

bool __thiscall EOPlus::Lexer::GetCharIf(Lexer *this,char *c,function<bool_(char)> *f)

{
  bool bVar1;
  int iVar2;
  char local_19;
  
  iVar2 = std::istream::peek();
  if (iVar2 != -1) {
    local_19 = (char)iVar2;
    if ((f->super__Function_base)._M_manager == (_Manager_type)0x0) {
      std::__throw_bad_function_call();
    }
    bVar1 = (*f->_M_invoker)((_Any_data *)f,&local_19);
    if (bVar1) {
      bVar1 = GetChar(this,c);
      return bVar1;
    }
  }
  return false;
}

Assistant:

bool Lexer::GetCharIf(char& c, std::function<bool(char)> f)
	{
		char cc = '\0';

		if (!this->PeekChar(cc) || !f(cc))
			return false;

		return this->GetChar(c);
	}